

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_uint64
drwav_read_pcm_frames_s32(drwav *pWav,drwav_uint64 framesToRead,drwav_int32 *pBufferOut)

{
  ushort uVar1;
  uint uVar2;
  drwav_uint64 dVar3;
  drwav_uint64 dVar4;
  byte *pbVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  drwav_int32 *pdVar14;
  undefined8 *puVar15;
  drwav_int32 dVar16;
  ulong uVar17;
  drwav_uint64 totalFramesRead;
  drwav_uint64 dVar18;
  drwav_int16 samples16 [2048];
  undefined8 local_1038;
  
  if (framesToRead == 0 || pWav == (drwav *)0x0) {
    dVar18 = 0;
  }
  else {
    if (pBufferOut == (drwav_int32 *)0x0) {
      dVar18 = drwav_read_pcm_frames_le(pWav,framesToRead,(void *)0x0);
      return dVar18;
    }
    dVar18 = 0;
    switch(pWav->translatedFormatTag) {
    case 1:
      if (pWav->bitsPerSample == 0x20) {
        dVar18 = drwav_read_pcm_frames_le(pWav,framesToRead,pBufferOut);
      }
      else {
        if ((pWav->bitsPerSample & 7) == 0) {
          uVar11 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
        }
        else {
          uVar11 = (uint)(pWav->fmt).blockAlign;
        }
        dVar18 = 0;
        dVar3 = 0;
        if (uVar11 != 0) {
          do {
            dVar18 = dVar3;
            if (framesToRead == 0) {
              return dVar18;
            }
            uVar6 = 0x1000 / (ulong)uVar11;
            if (framesToRead < 0x1000 / (ulong)uVar11) {
              uVar6 = framesToRead;
            }
            dVar4 = drwav_read_pcm_frames_le(pWav,uVar6,&local_1038);
            if (dVar4 != 0) {
              uVar1 = pWav->channels;
              uVar13 = dVar4 * uVar1;
              uVar6 = (ulong)uVar11 / (ulong)uVar1;
              uVar2 = (uint)uVar6;
              switch(uVar2) {
              case 1:
                if (uVar13 != 0 && pBufferOut != (drwav_int32 *)0x0) {
                  lVar8 = 0;
                  do {
                    pBufferOut[lVar8] = (*(byte *)((long)&local_1038 + lVar8) ^ 0xffffff80) << 0x18;
                    lVar8 = lVar8 + 1;
                  } while (uVar13 - lVar8 != 0);
                }
                break;
              case 2:
                if (uVar13 != 0 && pBufferOut != (drwav_int32 *)0x0) {
                  lVar8 = 0;
                  do {
                    pBufferOut[lVar8] = (uint)*(ushort *)((long)&local_1038 + lVar8 * 2) << 0x10;
                    lVar8 = lVar8 + 1;
                  } while (uVar13 - lVar8 != 0);
                }
                break;
              case 3:
                if (uVar13 != 0 && pBufferOut != (drwav_int32 *)0x0) {
                  pbVar5 = (byte *)((long)&local_1038 + 2);
                  lVar8 = 0;
                  do {
                    pBufferOut[lVar8] =
                         (uint)*pbVar5 << 0x18 | (uint)pbVar5[-1] << 0x10 | (uint)pbVar5[-2] << 8;
                    lVar8 = lVar8 + 1;
                    pbVar5 = pbVar5 + 3;
                  } while (uVar13 - lVar8 != 0);
                }
                break;
              case 4:
                if (uVar13 != 0) {
                  uVar6 = 0;
                  do {
                    pBufferOut[uVar6] = *(drwav_int32 *)((long)&local_1038 + uVar6 * 4);
                    uVar6 = uVar6 + 1;
                  } while ((uVar6 & 0xffffffff) <= uVar13 && uVar13 - (uVar6 & 0xffffffff) != 0);
                }
                break;
              default:
                if (uVar2 < 9) {
                  if (uVar13 != 0) {
                    uVar12 = 0;
                    puVar15 = &local_1038;
                    pdVar14 = pBufferOut;
                    do {
                      if (uVar11 < uVar1) {
                        dVar16 = 0;
                        uVar10 = 0;
                      }
                      else {
                        uVar10 = 0;
                        uVar17 = 0;
                        iVar7 = uVar2 * -8 + 0x40;
                        do {
                          uVar17 = uVar17 | (ulong)*(byte *)((long)puVar15 + uVar10) <<
                                            ((byte)iVar7 & 0x3f);
                          iVar7 = iVar7 + 8;
                          uVar10 = uVar10 + 1;
                        } while (uVar6 != uVar10);
                        dVar16 = (drwav_int32)(uVar17 >> 0x20);
                        uVar10 = uVar6;
                      }
                      puVar15 = (undefined8 *)((long)puVar15 + uVar10);
                      *pdVar14 = dVar16;
                      pdVar14 = pdVar14 + 1;
                      uVar12 = (ulong)((int)uVar12 + 1);
                    } while (uVar12 <= uVar13 && uVar13 - uVar12 != 0);
                  }
                }
                else {
                  memset(pBufferOut,0,uVar13 * 4);
                }
              }
              pBufferOut = pBufferOut + pWav->channels * dVar4;
              framesToRead = framesToRead - dVar4;
              dVar18 = dVar18 + dVar4;
            }
            dVar3 = dVar18;
          } while (dVar4 != 0);
        }
      }
      break;
    case 2:
      dVar18 = 0;
      do {
        if (framesToRead == 0) {
          return dVar18;
        }
        uVar6 = (ulong)(0x800 / pWav->channels);
        if (framesToRead < uVar6) {
          uVar6 = framesToRead;
        }
        dVar3 = drwav_read_pcm_frames_s16(pWav,uVar6,(drwav_int16 *)&local_1038);
        if (dVar3 != 0) {
          lVar8 = pWav->channels * dVar3;
          if (lVar8 != 0 && pBufferOut != (drwav_int32 *)0x0) {
            lVar9 = 0;
            do {
              pBufferOut[lVar9] = (uint)*(ushort *)((long)&local_1038 + lVar9 * 2) << 0x10;
              lVar9 = lVar9 + 1;
            } while (lVar8 - lVar9 != 0);
          }
          pBufferOut = pBufferOut + lVar8;
          framesToRead = framesToRead - dVar3;
          dVar18 = dVar18 + dVar3;
        }
      } while (dVar3 != 0);
      break;
    case 3:
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar11 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar11 = (uint)(pWav->fmt).blockAlign;
      }
      dVar18 = 0;
      dVar3 = 0;
      if (uVar11 != 0) {
        do {
          dVar18 = dVar3;
          if (framesToRead == 0) {
            return dVar18;
          }
          uVar6 = 0x1000 / (ulong)uVar11;
          if (framesToRead < 0x1000 / (ulong)uVar11) {
            uVar6 = framesToRead;
          }
          dVar4 = drwav_read_pcm_frames_le(pWav,uVar6,&local_1038);
          if (dVar4 != 0) {
            lVar8 = dVar4 * pWav->channels;
            uVar2 = uVar11 / pWav->channels;
            if (uVar2 == 8) {
              if (lVar8 != 0 && pBufferOut != (drwav_int32 *)0x0) {
                lVar9 = 0;
                do {
                  pBufferOut[lVar9] = (int)((double)(&local_1038)[lVar9] * 2147483648.0);
                  lVar9 = lVar9 + 1;
                } while (lVar8 - lVar9 != 0);
              }
            }
            else if (uVar2 == 4) {
              if (lVar8 != 0 && pBufferOut != (drwav_int32 *)0x0) {
                lVar9 = 0;
                do {
                  pBufferOut[lVar9] =
                       (int)(*(float *)((long)&local_1038 + lVar9 * 4) * 2.1474836e+09);
                  lVar9 = lVar9 + 1;
                } while (lVar8 - lVar9 != 0);
              }
            }
            else {
              memset(pBufferOut,0,lVar8 * 4);
            }
            pBufferOut = pBufferOut + pWav->channels * dVar4;
            framesToRead = framesToRead - dVar4;
            dVar18 = dVar18 + dVar4;
          }
          dVar3 = dVar18;
        } while (dVar4 != 0);
      }
      break;
    case 4:
    case 5:
      break;
    case 6:
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar11 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar11 = (uint)(pWav->fmt).blockAlign;
      }
      dVar18 = 0;
      dVar3 = 0;
      if (uVar11 != 0) {
        do {
          dVar18 = dVar3;
          if (framesToRead == 0) {
            return dVar18;
          }
          uVar6 = 0x1000 / (ulong)uVar11;
          if (framesToRead < 0x1000 / (ulong)uVar11) {
            uVar6 = framesToRead;
          }
          dVar4 = drwav_read_pcm_frames_le(pWav,uVar6,&local_1038);
          if (dVar4 != 0) {
            lVar8 = pWav->channels * dVar4;
            if (lVar8 != 0 && pBufferOut != (drwav_int32 *)0x0) {
              lVar9 = 0;
              do {
                pBufferOut[lVar9] =
                     (uint)g_drwavAlawTable[*(byte *)((long)&local_1038 + lVar9)] << 0x10;
                lVar9 = lVar9 + 1;
              } while (lVar8 - lVar9 != 0);
            }
            pBufferOut = pBufferOut + lVar8;
            framesToRead = framesToRead - dVar4;
            dVar18 = dVar18 + dVar4;
          }
          dVar3 = dVar18;
        } while (dVar4 != 0);
      }
      break;
    case 7:
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar11 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar11 = (uint)(pWav->fmt).blockAlign;
      }
      dVar18 = 0;
      if (uVar11 != 0) {
        do {
          if (framesToRead == 0) {
            return dVar18;
          }
          uVar6 = 0x1000 / (ulong)uVar11;
          if (framesToRead < 0x1000 / (ulong)uVar11) {
            uVar6 = framesToRead;
          }
          dVar3 = drwav_read_pcm_frames_le(pWav,uVar6,&local_1038);
          if (dVar3 != 0) {
            lVar8 = pWav->channels * dVar3;
            if (lVar8 != 0 && pBufferOut != (drwav_int32 *)0x0) {
              lVar9 = 0;
              do {
                pBufferOut[lVar9] =
                     (uint)g_drwavMulawTable[*(byte *)((long)&local_1038 + lVar9)] << 0x10;
                lVar9 = lVar9 + 1;
              } while (lVar8 - lVar9 != 0);
            }
            pBufferOut = pBufferOut + lVar8;
            framesToRead = framesToRead - dVar3;
            dVar18 = dVar18 + dVar3;
          }
        } while (dVar3 != 0);
      }
      break;
    default:
      if (pWav->translatedFormatTag == 0x11) {
        dVar18 = 0;
        do {
          if (framesToRead == 0) {
            return dVar18;
          }
          uVar6 = (ulong)(0x800 / pWav->channels);
          if (framesToRead < uVar6) {
            uVar6 = framesToRead;
          }
          dVar3 = drwav_read_pcm_frames_s16(pWav,uVar6,(drwav_int16 *)&local_1038);
          if (dVar3 != 0) {
            lVar8 = pWav->channels * dVar3;
            if (lVar8 != 0 && pBufferOut != (drwav_int32 *)0x0) {
              lVar9 = 0;
              do {
                pBufferOut[lVar9] = (uint)*(ushort *)((long)&local_1038 + lVar9 * 2) << 0x10;
                lVar9 = lVar9 + 1;
              } while (lVar8 - lVar9 != 0);
            }
            pBufferOut = pBufferOut + lVar8;
            framesToRead = framesToRead - dVar3;
            dVar18 = dVar18 + dVar3;
          }
        } while (dVar3 != 0);
      }
    }
  }
  return dVar18;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_s32(drwav* pWav, drwav_uint64 framesToRead, drwav_int32* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }

    if (pBufferOut == NULL) {
        return drwav_read_pcm_frames(pWav, framesToRead, NULL);
    }

    /* Don't try to read more samples than can potentially fit in the output buffer. */
    if (framesToRead * pWav->channels * sizeof(drwav_int32) > DRWAV_SIZE_MAX) {
        framesToRead = DRWAV_SIZE_MAX / sizeof(drwav_int32) / pWav->channels;
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_PCM) {
        return drwav_read_pcm_frames_s32__pcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        return drwav_read_pcm_frames_s32__msadpcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_IEEE_FLOAT) {
        return drwav_read_pcm_frames_s32__ieee(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ALAW) {
        return drwav_read_pcm_frames_s32__alaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_MULAW) {
        return drwav_read_pcm_frames_s32__mulaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        return drwav_read_pcm_frames_s32__ima(pWav, framesToRead, pBufferOut);
    }

    return 0;
}